

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BufferTestUtil::BufferVerifier::BufferVerifier
          (BufferVerifier *this,Context *context,VerifyType verifyType)

{
  VertexArrayVerifier *this_00;
  TestError *this_01;
  
  this->m_verifier = (BufferVerifierBase *)0x0;
  if (verifyType == VERIFY_AS_INDEX_ARRAY) {
    this_00 = (VertexArrayVerifier *)operator_new(0x38);
    IndexArrayVerifier::IndexArrayVerifier((IndexArrayVerifier *)this_00,context);
  }
  else {
    if (verifyType != VERIFY_AS_VERTEX_ARRAY) {
      this_01 = (TestError *)__cxa_allocate_exception();
      tcu::TestError::TestError
                (this_01,"Unsupported verifier",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBufferTestUtil.cpp"
                 ,0x101);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_00 = (VertexArrayVerifier *)operator_new(0x38);
    VertexArrayVerifier::VertexArrayVerifier(this_00,context);
  }
  this->m_verifier = &this_00->super_BufferVerifierBase;
  return;
}

Assistant:

BufferVerifier::BufferVerifier (Context& context, VerifyType verifyType)
	: m_verifier(DE_NULL)
{
	switch (verifyType)
	{
		case VERIFY_AS_VERTEX_ARRAY:	m_verifier = new VertexArrayVerifier(context);	break;
		case VERIFY_AS_INDEX_ARRAY:		m_verifier = new IndexArrayVerifier	(context);	break;
		default:
			TCU_FAIL("Unsupported verifier");
	}
}